

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physics.c
# Opt level: O0

QuadTreeNode * RunPhysics(Level *lvl,double *pos,double *vec,double TimeToGo,Animation *PAnim)

{
  SmallVertex *pSVar1;
  double *pdVar2;
  Edge *E_00;
  Animation *in_RCX;
  double *in_RDX;
  double *in_RSI;
  bool bVar3;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Container *FirstEdge;
  Container *EPtr;
  int Contact;
  double r;
  Edge *E;
  double d2;
  double d1;
  void *CollPtr;
  double ColPoint [2];
  double End [2];
  double NCollTime;
  double CollTime;
  QuadTreeNode *CollTree;
  double MoveVec [2];
  Animation *in_stack_ffffffffffffff28;
  Level *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 uVar11;
  QuadTreeNode *local_b8;
  QuadTreeNode *local_b0;
  QuadTreeNode *local_80;
  double local_48;
  QuadTreeNode *local_40;
  double local_20;
  
  local_40 = GetCollisionNode(in_stack_ffffffffffffff30,(double *)in_stack_ffffffffffffff28,
                              (double *)0x1156ad);
  in_RDX[1] = in_RDX[1] + 0.10000000149011612;
  *in_RDX = *in_RDX * 0.996999979019165;
  in_RDX[1] = in_RDX[1] * 0.996999979019165;
  local_b0 = (QuadTreeNode *)local_40->Contents;
  while( true ) {
    bVar3 = false;
    if (local_b0 != (QuadTreeNode *)0x0) {
      bVar3 = *(int *)((local_b0->Bounder).TL.Pos + 1) != 2;
    }
    if (!bVar3) break;
    local_b0 = (QuadTreeNode *)(local_b0->Bounder).TL.Pos[0];
  }
  local_b8 = local_b0;
  uVar11 = 0;
  local_20 = in_XMM0_Qa;
  do {
    bVar3 = false;
    for (local_b0 = local_b8; local_b0 != (QuadTreeNode *)0x0;
        local_b0 = (QuadTreeNode *)(local_b0->Bounder).TL.Pos[0]) {
      dVar4 = *(double *)((long)(local_b0->Bounder).BR.Pos[0] + 0x30) * *in_RSI +
              *(double *)((long)(local_b0->Bounder).BR.Pos[0] + 0x38) * in_RSI[1] +
              *(double *)((long)(local_b0->Bounder).BR.Pos[0] + 0x40);
      if (((((-0.5 <= dVar4) && (dVar4 <= 0.05000000074505806)) &&
           (*(double *)(local_b0->Bounder).BR.Pos[0] <= *in_RSI)) &&
          ((*in_RSI <= *(double *)((long)(local_b0->Bounder).BR.Pos[0] + 0x10) &&
           (*(double *)((long)(local_b0->Bounder).BR.Pos[0] + 8) <= in_RSI[1])))) &&
         (in_RSI[1] <= *(double *)((long)(local_b0->Bounder).BR.Pos[0] + 0x18))) {
        *in_RSI = *(double *)((long)(local_b0->Bounder).BR.Pos[0] + 0x30) *
                  (0.05000000074505806 - dVar4) + *in_RSI;
        in_RSI[1] = *(double *)((long)(local_b0->Bounder).BR.Pos[0] + 0x38) *
                    (0.05000000074505806 - dVar4) + in_RSI[1];
        bVar3 = true;
      }
    }
    dVar4 = local_20 * *in_RDX;
    dVar5 = local_20 * in_RDX[1];
    local_48 = 1.0;
    dVar6 = *in_RSI + dVar4;
    dVar7 = in_RSI[1] + dVar5;
    local_80 = (QuadTreeNode *)0x0;
    pSVar1 = &(local_40->Bounder).BR;
    if ((pSVar1->Pos[0] <= dVar6 && dVar6 != pSVar1->Pos[0]) &&
       (dVar8 = (dVar6 - (local_40->Bounder).BR.Pos[0]) / dVar4, dVar8 < 1.0)) {
      local_80 = local_40;
      local_48 = dVar8;
    }
    if ((dVar6 < (local_40->Bounder).TL.Pos[0]) &&
       (dVar8 = (dVar6 - (local_40->Bounder).TL.Pos[0]) / dVar4, dVar8 < local_48)) {
      local_80 = local_40;
      local_48 = dVar8;
    }
    pdVar2 = (local_40->Bounder).BR.Pos + 1;
    if ((*pdVar2 <= dVar7 && dVar7 != *pdVar2) &&
       (dVar8 = (dVar7 - (local_40->Bounder).BR.Pos[1]) / dVar5, dVar8 < local_48)) {
      local_80 = local_40;
      local_48 = dVar8;
    }
    if ((dVar7 < (local_40->Bounder).TL.Pos[1]) &&
       (dVar8 = (dVar7 - (local_40->Bounder).TL.Pos[1]) / dVar5, dVar8 < local_48)) {
      local_80 = local_40;
      local_48 = dVar8;
    }
    for (local_b0 = local_b8; local_b0 != (QuadTreeNode *)0x0;
        local_b0 = (QuadTreeNode *)(local_b0->Bounder).TL.Pos[0]) {
      dVar9 = *(double *)((long)(local_b0->Bounder).BR.Pos[0] + 0x30) * *in_RSI +
              *(double *)((long)(local_b0->Bounder).BR.Pos[0] + 0x38) * in_RSI[1] +
              *(double *)((long)(local_b0->Bounder).BR.Pos[0] + 0x40);
      dVar8 = *(double *)((long)(local_b0->Bounder).BR.Pos[0] + 0x30) * dVar6 +
              *(double *)((long)(local_b0->Bounder).BR.Pos[0] + 0x38) * dVar7 +
              *(double *)((long)(local_b0->Bounder).BR.Pos[0] + 0x40);
      if ((-0.05000000074505806 <= dVar9) && (dVar8 < 0.0)) {
        dVar9 = dVar9 / (dVar9 - dVar8);
        dVar8 = dVar9 * dVar4 + *in_RSI;
        dVar10 = dVar9 * dVar5 + in_RSI[1];
        if ((*(double *)(local_b0->Bounder).BR.Pos[0] <= dVar8) &&
           (((dVar8 <= *(double *)((long)(local_b0->Bounder).BR.Pos[0] + 0x10) &&
             (*(double *)((long)(local_b0->Bounder).BR.Pos[0] + 8) <= dVar10)) &&
            (dVar10 <= *(double *)((long)(local_b0->Bounder).BR.Pos[0] + 0x18))))) {
          local_80 = local_b0;
          local_48 = dVar9;
        }
      }
    }
    *in_RSI = dVar4 * local_48 + *in_RSI;
    in_RSI[1] = dVar5 * local_48 + in_RSI[1];
    if (!bVar3) {
      AdvanceAnimation(in_RCX,0.0,0);
    }
    if (local_80 == (QuadTreeNode *)0x0) {
      if (!bVar3) {
        if ((KeyFlags & 1U) != 0) {
          *in_RDX = *in_RDX - 0.05000000074505806;
          KeyFlags = KeyFlags | 0x20;
        }
        if ((KeyFlags & 2U) != 0) {
          *in_RDX = *in_RDX + 0.05000000074505806;
          KeyFlags = KeyFlags & 0xffffffdf;
        }
        if ((0.0 < in_RSI[2]) &&
           (in_RSI[2] = -(local_20 * local_48) * 0.029999999329447746 + in_RSI[2],
           in_RSI[2] <= 0.0 && in_RSI[2] != 0.0)) {
          in_RSI[2] = 0.0;
        }
        if ((in_RSI[2] <= 0.0 && in_RSI[2] != 0.0) &&
           (in_RSI[2] = local_20 * local_48 * 0.029999999329447746 + in_RSI[2], 0.0 < in_RSI[2])) {
          in_RSI[2] = 0.0;
        }
      }
    }
    else if (local_80 == local_40) {
      local_40 = GetCollisionNode(in_stack_ffffffffffffff30,(double *)in_stack_ffffffffffffff28,
                                  (double *)0x115dd7);
      local_b0 = (QuadTreeNode *)local_40->Contents;
      while( true ) {
        bVar3 = false;
        if (local_b0 != (QuadTreeNode *)0x0) {
          bVar3 = *(int *)((local_b0->Bounder).TL.Pos + 1) != 2;
        }
        if (!bVar3) break;
        local_b0 = (QuadTreeNode *)(local_b0->Bounder).TL.Pos[0];
      }
      local_b8 = local_b0;
      in_stack_ffffffffffffff46 = 0;
    }
    else {
      E_00 = (Edge *)(local_80->Bounder).BR.Pos[0];
      dVar4 = FixUp(in_RDX,E_00->a,E_00->b);
      SetAngle((double)CONCAT17(uVar11,CONCAT16(in_stack_ffffffffffffff46,
                                                CONCAT24(in_stack_ffffffffffffff44,
                                                         in_stack_ffffffffffffff40))),
               (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (double *)in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      in_stack_ffffffffffffff30 = (Level *)(*in_RDX * E_00->b + -(in_RDX[1] * E_00->a));
      in_stack_ffffffffffffff3c = 0xbf800000;
      in_stack_ffffffffffffff40 = 1.0;
      if ((KeyFlags & 0x20U) == 0) {
        in_stack_ffffffffffffff40 = -1.0;
      }
      in_stack_ffffffffffffff28 = in_RCX;
      AdvanceAnimation(in_RCX,(double)in_stack_ffffffffffffff30 * (double)in_stack_ffffffffffffff40,
                       1);
      DoFriction(dVar4,E_00,in_RDX);
    }
    local_20 = -local_20 * local_48 + local_20;
  } while (0.009999999776482582 < local_20);
  return local_40;
}

Assistant:

struct QuadTreeNode *RunPhysics(struct Level *lvl, double *pos,
                                double *vec, double TimeToGo,
                                struct Animation *PAnim)
{
   double MoveVec[2];
   struct QuadTreeNode *CollTree = GetCollisionNode(lvl, pos, vec);
   double CollTime, NCollTime;
   double End[2], ColPoint[2];
   void *CollPtr;
   double d1, d2;
   struct Edge *E;
   double r;
   int Contact;
   struct Container *EPtr, *FirstEdge;

   /* Step 1: apply gravity */
   vec[1] += 0.1f;

   /* Step 2: apply atmoshperic resistance */
   vec[0] *= 0.997f;
   vec[1] *= 0.997f;

   EPtr = CollTree->Contents;
   while (EPtr && EPtr->Type != EDGE)
      EPtr = EPtr->Next;
   FirstEdge = EPtr;

   /* Step 2: do collisions and reactions */
   do {
      Contact = false;

      /* rounding error fixup */
      EPtr = FirstEdge;
      while (EPtr) {
         /* simple line test */
         d1 =
            EPtr->Content.E->a * pos[0] +
            EPtr->Content.E->b * pos[1] + EPtr->Content.E->c;

         if (d1 >= (-0.5f) && d1 <= 0.05f &&
             pos[0] >= EPtr->Content.E->Bounder.TL.Pos[0]
             && pos[0] <= EPtr->Content.E->Bounder.BR.Pos[0]
             && pos[1] >= EPtr->Content.E->Bounder.TL.Pos[1]
             && pos[1] <= EPtr->Content.E->Bounder.BR.Pos[1]
            ) {
            pos[0] += EPtr->Content.E->a * (0.05f - d1);
            pos[1] += EPtr->Content.E->b * (0.05f - d1);
            Contact = true;
         }

         EPtr = EPtr->Next;
      }

      MoveVec[0] = TimeToGo * vec[0];
      MoveVec[1] = TimeToGo * vec[1];

      CollTime = 1.0f;
      End[0] = pos[0] + MoveVec[0];
      End[1] = pos[1] + MoveVec[1];
      CollPtr = NULL;

      /* search for collisions here */

      /* test 1: do we hit the edge of this collision tree node? */
      if (End[0] > CollTree->Bounder.BR.Pos[0]) {
         NCollTime = (End[0] - CollTree->Bounder.BR.Pos[0]) / MoveVec[0];
         if (NCollTime < CollTime) {
            CollTime = NCollTime;
            CollPtr = (void *)CollTree;
         }
      }

      if (End[0] < CollTree->Bounder.TL.Pos[0]) {
         NCollTime = (End[0] - CollTree->Bounder.TL.Pos[0]) / MoveVec[0];
         if (NCollTime < CollTime) {
            CollTime = NCollTime;
            CollPtr = (void *)CollTree;
         }
      }

      if (End[1] > CollTree->Bounder.BR.Pos[1]) {
         NCollTime = (End[1] - CollTree->Bounder.BR.Pos[1]) / MoveVec[1];
         if (NCollTime < CollTime) {
            CollTime = NCollTime;
            CollPtr = (void *)CollTree;
         }
      }

      if (End[1] < CollTree->Bounder.TL.Pos[1]) {
         NCollTime = (End[1] - CollTree->Bounder.TL.Pos[1]) / MoveVec[1];
         if (NCollTime < CollTime) {
            CollTime = NCollTime;
            CollPtr = (void *)CollTree;
         }
      }

      /* test 3: do we hit any of the edges contained in the tree? */
      EPtr = FirstEdge;
      while (EPtr) {
         /* simple line test */
         d1 =
            EPtr->Content.E->a * pos[0] +
            EPtr->Content.E->b * pos[1] + EPtr->Content.E->c;
         d2 =
            EPtr->Content.E->a * End[0] +
            EPtr->Content.E->b * End[1] + EPtr->Content.E->c;
         if ((d1 >= (-0.05f)) && (d2 < 0)) {
            NCollTime = d1 / (d1 - d2);

            ColPoint[0] = pos[0] + NCollTime * MoveVec[0];
            ColPoint[1] = pos[1] + NCollTime * MoveVec[1];
            if (ColPoint[0] >= EPtr->Content.E->Bounder.TL.Pos[0]
                && ColPoint[0] <= EPtr->Content.E->Bounder.BR.Pos[0]
                && ColPoint[1] >= EPtr->Content.E->Bounder.TL.Pos[1]
                && ColPoint[1] <= EPtr->Content.E->Bounder.BR.Pos[1]
               ) {
               CollTime = NCollTime;
               CollPtr = (void *)EPtr;
            }
         }

         /* move to next edge */
         EPtr = EPtr->Next;
      }

      /* advance - apply motion and resulting friction here! */
      pos[0] += MoveVec[0] * CollTime;
      pos[1] += MoveVec[1] * CollTime;
      if (!Contact)
         AdvanceAnimation(PAnim, 0, false);

      /* fix up */
      if (CollPtr) {
         if (CollPtr == (void *)CollTree) {
            CollTree = GetCollisionNode(lvl, pos, vec);
            EPtr = CollTree->Contents;
            while (EPtr && EPtr->Type != EDGE)
               EPtr = EPtr->Next;
            FirstEdge = EPtr;
         } else {
            /* edge collision */
            E = ((struct Container *)CollPtr)->Content.E;
            r = FixUp(vec, E->a, E->b);

            SetAngle(E->a, E->b, &pos[2],
                     (fabs(vec[0] * E->b - vec[1] * E->a) > 0.5f));
            AdvanceAnimation(PAnim,
                             (vec[0] * E->b -
                              vec[1] * E->a) *
                             ((KeyFlags & KEYFLAG_FLIP) ? 1.0f : -1.0f),
                             true);

            /* apply friction */
            DoFriction(r, E, vec);
         }
      } else if (!Contact) {
         /* check if currently in contact with any surface. If not then do empty space movement */
         if (KeyFlags & KEYFLAG_LEFT) {
            vec[0] -= 0.05f;
            KeyFlags |= KEYFLAG_FLIP;
         }
         if (KeyFlags & KEYFLAG_RIGHT) {
            vec[0] += 0.05f;
            KeyFlags &= ~KEYFLAG_FLIP;
         }
         if (pos[2] > 0) {
            pos[2] -= TimeToGo * CollTime * 0.03f;
            if (pos[2] < 0)
               pos[2] = 0;
         }
         if (pos[2] < 0) {
            pos[2] += TimeToGo * CollTime * 0.03f;
            if (pos[2] > 0)
               pos[2] = 0;
         }
      }

      /* reduce time & continue */
      TimeToGo -= TimeToGo * CollTime;
   }
   while (TimeToGo > 0.01f);

   return CollTree;
}